

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gesture_acts.cpp
# Opt level: O0

void __thiscall gesture_acts::gesture_acts(gesture_acts *this)

{
  gesture_acts *this_local;
  
  std::__cxx11::string::string((string *)&this->uid);
  std::vector<datarow,_std::allocator<datarow>_>::vector(&this->vec_dr);
  this->id = 0;
  std::__cxx11::string::operator=((string *)&this->uid,"");
  this->age = 0;
  this->gender = false;
  this->hand = false;
  this->gid = -1;
  return;
}

Assistant:

gesture_acts::gesture_acts(){
    this->id = 0;
    this->uid = "";
    this->age = 0;
    this->gender = false;
    this->hand = false;
    this->gid = -1;
}